

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall
fasttext::FastText::printInfo(FastText *this,real progress,real loss,ostream *log_stream)

{
  long lVar1;
  ostream *poVar2;
  tuple<long,_double,_double> local_38;
  
  progressInfo(&local_38,this,progress);
  *(uint *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x18) =
       *(uint *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(log_stream,"Progress: ",10);
  lVar1 = *(long *)log_stream;
  *(undefined8 *)(log_stream + *(long *)(lVar1 + -0x18) + 8) = 1;
  *(undefined8 *)(log_stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  poVar2 = std::ostream::_M_insert<double>((double)(progress * 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"%",1);
  std::__ostream_insert<char,std::char_traits<char>>(log_stream," words/sec/thread: ",0x13);
  *(undefined8 *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x10) = 7;
  std::ostream::_M_insert<long>((long)log_stream);
  std::__ostream_insert<char,std::char_traits<char>>(log_stream," lr: ",5);
  lVar1 = *(long *)log_stream;
  *(undefined8 *)(log_stream + *(long *)(lVar1 + -0x18) + 0x10) = 9;
  *(undefined8 *)(log_stream + *(long *)(lVar1 + -0x18) + 8) = 6;
  std::ostream::_M_insert<double>
            (local_38.super__Tuple_impl<0UL,_long,_double,_double>.
             super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>.
             _M_head_impl);
  std::__ostream_insert<char,std::char_traits<char>>(log_stream," avg.loss: ",0xb);
  lVar1 = *(long *)log_stream;
  *(undefined8 *)(log_stream + *(long *)(lVar1 + -0x18) + 0x10) = 9;
  *(undefined8 *)(log_stream + *(long *)(lVar1 + -0x18) + 8) = 6;
  std::ostream::_M_insert<double>((double)loss);
  std::__ostream_insert<char,std::char_traits<char>>(log_stream," ETA: ",6);
  utils::ClockPrint::ClockPrint
            ((ClockPrint *)&local_38,
             (int32_t)(long)(double)local_38.super__Tuple_impl<0UL,_long,_double,_double>.
                                    super__Tuple_impl<1UL,_double,_double>.
                                    super__Tuple_impl<2UL,_double>.
                                    super__Head_base<2UL,_double,_false>._M_head_impl);
  utils::operator<<(log_stream,(ClockPrint *)&local_38);
  std::ostream::flush();
  return;
}

Assistant:

void FastText::printInfo(real progress, real loss, std::ostream& log_stream) {
  double wst;
  double lr;
  int64_t eta;
  std::tie<double, double, int64_t>(wst, lr, eta) = progressInfo(progress);

  log_stream << std::fixed;
  log_stream << "Progress: ";
  log_stream << std::setprecision(1) << std::setw(5) << (progress * 100) << "%";
  log_stream << " words/sec/thread: " << std::setw(7) << int64_t(wst);
  log_stream << " lr: " << std::setw(9) << std::setprecision(6) << lr;
  log_stream << " avg.loss: " << std::setw(9) << std::setprecision(6) << loss;
  log_stream << " ETA: " << utils::ClockPrint(eta);
  log_stream << std::flush;
}